

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

int __thiscall
glslang::TParseContext::getIoArrayImplicitSize
          (TParseContext *this,TQualifier *qualifier,TString *featureString)

{
  undefined4 uVar1;
  bool bVar2;
  int iVar3;
  TLayoutGeometry TVar4;
  char *pcVar5;
  int local_70;
  int local_6c;
  uint maxPrimitives;
  uint maxVertices;
  undefined1 local_50 [8];
  TString str;
  int expectedSize;
  TString *featureString_local;
  TQualifier *qualifier_local;
  TParseContext *this_local;
  
  str.field_2._12_4_ = 0;
  pool_allocator<char>::pool_allocator((pool_allocator<char> *)&maxPrimitives);
  std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
  basic_string<glslang::std::allocator<char>>
            ((basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)local_50,
             "unknown",(pool_allocator<char> *)&maxPrimitives);
  iVar3 = TIntermediate::getVertices
                    ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  if (iVar3 == -1) {
    local_6c = 0;
  }
  else {
    local_6c = TIntermediate::getVertices
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate);
  }
  if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangGeometry) {
    TVar4 = TIntermediate::getInputPrimitive
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    str.field_2._12_4_ = TQualifier::mapGeometryToSize(TVar4);
    TVar4 = TIntermediate::getInputPrimitive
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    pcVar5 = TQualifier::getGeometryString(TVar4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50
              ,pcVar5);
  }
  else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangTessControl) {
    str.field_2._12_4_ = local_6c;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50
              ,"vertices");
  }
  else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangFragment) {
    str.field_2._12_4_ = 3;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50
              ,"vertices");
  }
  else if ((this->super_TParseContextBase).super_TParseVersions.language == EShLangMesh) {
    iVar3 = TIntermediate::getPrimitives
                      ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    if (iVar3 == -1) {
      local_70 = 0;
    }
    else {
      local_70 = TIntermediate::getPrimitives
                           ((this->super_TParseContextBase).super_TParseVersions.intermediate);
    }
    if (((uint)(*(ulong *)&qualifier->field_0x8 >> 7) & 0x1ff) == 0x79) {
      TVar4 = TIntermediate::getOutputPrimitive
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      iVar3 = TQualifier::mapGeometryToSize(TVar4);
      str.field_2._12_4_ = local_70 * iVar3;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_50,"max_primitives*");
      TVar4 = TIntermediate::getOutputPrimitive
                        ((this->super_TParseContextBase).super_TParseVersions.intermediate);
      pcVar5 = TQualifier::getGeometryString(TVar4);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator+=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                 local_50,pcVar5);
    }
    else if (((((uint)(*(ulong *)&qualifier->field_0x8 >> 7) & 0x1ff) == 0x8b) ||
             (((uint)(*(ulong *)&qualifier->field_0x8 >> 7) & 0x1ff) == 0x8a)) ||
            (((uint)(*(ulong *)&qualifier->field_0x8 >> 7) & 0x1ff) == 0x89)) {
      str.field_2._12_4_ = local_70;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
      operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_50,"max_primitives");
    }
    else {
      bVar2 = TQualifier::isPerPrimitive(qualifier);
      if (bVar2) {
        str.field_2._12_4_ = local_70;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_50,"max_primitives");
      }
      else {
        str.field_2._12_4_ = local_6c;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
        operator=((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                  local_50,"max_vertices");
      }
    }
  }
  if (featureString != (TString *)0x0) {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
    operator=(featureString,
              (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)local_50
             );
  }
  uVar1 = str.field_2._12_4_;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
  ~basic_string((basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                local_50);
  return uVar1;
}

Assistant:

int TParseContext::getIoArrayImplicitSize(const TQualifier &qualifier, TString *featureString) const
{
    int expectedSize = 0;
    TString str = "unknown";
    unsigned int maxVertices = intermediate.getVertices() != TQualifier::layoutNotSet ? intermediate.getVertices() : 0;

    if (language == EShLangGeometry) {
        expectedSize = TQualifier::mapGeometryToSize(intermediate.getInputPrimitive());
        str = TQualifier::getGeometryString(intermediate.getInputPrimitive());
    }
    else if (language == EShLangTessControl) {
        expectedSize = maxVertices;
        str = "vertices";
    } else if (language == EShLangFragment) {
        // Number of vertices for Fragment shader is always three.
        expectedSize = 3;
        str = "vertices";
    } else if (language == EShLangMesh) {
        unsigned int maxPrimitives =
            intermediate.getPrimitives() != TQualifier::layoutNotSet ? intermediate.getPrimitives() : 0;
        if (qualifier.builtIn == EbvPrimitiveIndicesNV) {
            expectedSize = maxPrimitives * TQualifier::mapGeometryToSize(intermediate.getOutputPrimitive());
            str = "max_primitives*";
            str += TQualifier::getGeometryString(intermediate.getOutputPrimitive());
        }
        else if (qualifier.builtIn == EbvPrimitiveTriangleIndicesEXT || qualifier.builtIn == EbvPrimitiveLineIndicesEXT ||
                 qualifier.builtIn == EbvPrimitivePointIndicesEXT) {
            expectedSize = maxPrimitives;
            str = "max_primitives";
        }
        else if (qualifier.isPerPrimitive()) {
            expectedSize = maxPrimitives;
            str = "max_primitives";
        }
        else {
            expectedSize = maxVertices;
            str = "max_vertices";
        }
    }
    if (featureString)
        *featureString = str;
    return expectedSize;
}